

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O3

bool __thiscall
Kernel::ScanAndApplyFormulaUnitTransformer::apply
          (ScanAndApplyFormulaUnitTransformer *this,UnitList **units)

{
  UnitList *pUVar1;
  List<Kernel::Unit_*> *pLVar2;
  int iVar3;
  Unit *in_RAX;
  List<Kernel::Unit_*> **ppLVar4;
  List<Kernel::Unit_*> *pLVar5;
  List<Kernel::Unit_*> **ppLVar6;
  List<Kernel::Unit_*> *pLVar7;
  void **head;
  UnitList *pUVar8;
  UnitList *pUVar9;
  bool bVar10;
  bool bVar11;
  Unit *newUnit;
  Unit *local_38;
  undefined4 extraout_var;
  
  local_38 = in_RAX;
  (*this->_vptr_ScanAndApplyFormulaUnitTransformer[2])(this,*units);
  if (*units == (UnitList *)0x0) {
    pUVar8 = (List<Kernel::Unit_*> *)0x0;
    pUVar9 = (UnitList *)0x0;
    bVar10 = false;
  }
  else {
    bVar11 = true;
    ppLVar4 = (List<Kernel::Unit_*> **)&DAT_00000008;
    bVar10 = false;
    pUVar9 = (UnitList *)0x0;
    pUVar8 = (UnitList *)0x0;
    do {
      if (bVar11) {
        ppLVar4 = units;
        pUVar8 = pUVar9;
      }
      pUVar9 = pUVar8;
      pUVar1 = *ppLVar4;
      iVar3 = (*this->_vptr_ScanAndApplyFormulaUnitTransformer
                [(ulong)((pUVar1->_head->field_0x4 & 1) == 0) + 4])(this,pUVar1->_head,&local_38);
      pUVar8 = pUVar1;
      if ((char)iVar3 != '\0') {
        if (local_38 == (Unit *)0x0) {
          if (pUVar1 == *units) {
            *units = (*units)->_tail;
            pUVar1->_head = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            bVar10 = true;
            pUVar8 = (UnitList *)0x0;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pUVar1;
          }
          else {
            pUVar9->_tail = pUVar1->_tail;
            pUVar1->_head = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            bVar10 = true;
            pUVar8 = pUVar9;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pUVar1;
          }
        }
        else {
          pUVar1->_head = local_38;
          bVar10 = true;
        }
      }
      ppLVar4 = &pUVar8->_tail;
      bVar11 = pUVar8 == (UnitList *)0x0;
      ppLVar6 = ppLVar4;
      if (bVar11) {
        ppLVar6 = units;
      }
    } while (*ppLVar6 != (List<Kernel::Unit_*> *)0x0);
  }
  iVar3 = (*this->_vptr_ScanAndApplyFormulaUnitTransformer[3])(this);
  pLVar5 = (List<Kernel::Unit_*> *)CONCAT44(extraout_var,iVar3);
  pLVar2 = pLVar5;
  if (pLVar5 != (List<Kernel::Unit_*> *)0x0) {
    do {
      pLVar7 = pLVar2;
      pLVar2 = pLVar7->_tail;
    } while (pLVar2 != (List<Kernel::Unit_*> *)0x0);
    ppLVar4 = &pUVar9->_tail;
    if (pUVar9 == (UnitList *)0x0) {
      ppLVar4 = units;
    }
    *ppLVar4 = pLVar5;
    pLVar7->_tail = pUVar8;
    bVar10 = true;
  }
  return bVar10;
}

Assistant:

bool ScanAndApplyFormulaUnitTransformer::apply(UnitList*& units)
{
  scan(units);

  bool modified = false;

  UnitList::DelIterator uit(units);
  while(uit.hasNext()) {
    Unit* u = uit.next();
    Unit* newUnit;

    if(!apply(u, newUnit)) {
      continue;
    }
    if(newUnit==0) {
      uit.del();
    }
    else {
      uit.replace(newUnit);
    }
    modified = true;
  }

  UnitList* added = getIntroducedFormulas();
  if(added) {
    modified = true;
    uit.insert(added);
  }

  return modified;
}